

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O0

void Ivy_ManDfs_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Vec_Int_t *vNodes_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ObjIsMarkA(pObj);
  if (iVar1 == 0) {
    Ivy_ObjSetMarkA(pObj);
    iVar1 = Ivy_ObjIsConst1(pObj);
    if ((iVar1 == 0) && (iVar1 = Ivy_ObjIsCi(pObj), iVar1 == 0)) {
      iVar1 = Ivy_ObjIsBuf(pObj);
      if ((iVar1 == 0) &&
         ((iVar1 = Ivy_ObjIsAnd(pObj), iVar1 == 0 && (iVar1 = Ivy_ObjIsExor(pObj), iVar1 == 0)))) {
        __assert_fail("Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                      ,0x3f,"void Ivy_ManDfs_rec(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *)");
      }
      pIVar2 = Ivy_ObjFanin0(pObj);
      Ivy_ManDfs_rec(p,pIVar2,vNodes);
      iVar1 = Ivy_ObjIsBuf(pObj);
      if (iVar1 == 0) {
        pIVar2 = Ivy_ObjFanin1(pObj);
        Ivy_ManDfs_rec(p,pIVar2,vNodes);
      }
      if ((p->pHaig == (Ivy_Man_t *)0x0) && (pObj->pEquiv != (Ivy_Obj_t *)0x0)) {
        pIVar2 = Ivy_Regular(pObj->pEquiv);
        Ivy_ManDfs_rec(p,pIVar2,vNodes);
      }
      Vec_IntPush(vNodes,pObj->Id);
    }
    else if ((p->pHaig == (Ivy_Man_t *)0x0) && (pObj->pEquiv != (Ivy_Obj_t *)0x0)) {
      pIVar2 = Ivy_Regular(pObj->pEquiv);
      Ivy_ManDfs_rec(p,pIVar2,vNodes);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects nodes in the DFS order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ivy_ManDfs_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Ivy_ObjIsMarkA(pObj) )
        return;
    Ivy_ObjSetMarkA(pObj);
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsCi(pObj) )
    {
        if ( p->pHaig == NULL && pObj->pEquiv )
            Ivy_ManDfs_rec( p, Ivy_Regular(pObj->pEquiv), vNodes );
        return;
    }
//printf( "visiting node %d\n", pObj->Id );
/*
    if ( pObj->Id == 87 || pObj->Id == 90 )
    {
        int y = 0;
    }
*/
    assert( Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj) );
    Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    if ( !Ivy_ObjIsBuf(pObj) )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin1(pObj), vNodes );
    if ( p->pHaig == NULL && pObj->pEquiv )
        Ivy_ManDfs_rec( p, Ivy_Regular(pObj->pEquiv), vNodes );
    Vec_IntPush( vNodes, pObj->Id );

//printf( "adding node %d with fanins %d and %d and equiv %d (refs = %d)\n", 
//       pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id, 
//       pObj->pEquiv? Ivy_Regular(pObj->pEquiv)->Id: -1, Ivy_ObjRefs(pObj) );
}